

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall
kratos::PortPackedVisitor::process_struct_
          (PortPackedVisitor *this,PackedStruct *struct_def,Var *var)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
  *this_00;
  pointer pPVar1;
  bool bVar2;
  iterator iVar3;
  mapped_type *ppPVar4;
  VarException *this_01;
  mapped_type *ppVVar5;
  PackedStructFieldDef *attr;
  pointer pPVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_88;
  mapped_type local_80;
  string local_78;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  PackedStruct *local_40;
  PackedStruct *struct_def_local;
  Var *var_local;
  
  this_00 = &this->structs_;
  local_40 = struct_def;
  struct_def_local = (PackedStruct *)var;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
          ::find(&this_00->_M_t,&struct_def->struct_name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->structs_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>>
    ::_M_emplace_unique<std::__cxx11::string&,kratos::PackedStruct*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>>
                *)this_00,&struct_def->struct_name,&local_40);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
    ::_M_emplace_unique<std::__cxx11::string&,kratos::Var*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                *)&this->struct_ports_,&local_40->struct_name,(Var **)&struct_def_local);
    pPVar1 = (local_40->attributes).
             super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pPVar6 = (local_40->attributes).
                  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar1; pPVar6 = pPVar6 + 1)
    {
      if (pPVar6->struct_ != (PackedStruct *)0x0) {
        process_struct_(this,pPVar6->struct_,(Var *)struct_def_local);
      }
    }
  }
  else {
    ppPVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
              ::at(this_00,&struct_def->struct_name);
    bVar2 = PackedStruct::same(struct_def,*ppPVar4);
    if (!bVar2) {
      this_01 = (VarException *)__cxa_allocate_exception(0x10);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(struct_def->struct_name)._M_dataplus._M_p
      ;
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)(struct_def->struct_name)._M_string_length;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x2b;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_78,(detail *)"redefinition of different packed struct {0}",format_str,args);
      local_88 = var;
      ppVVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                ::at(&this->struct_ports_,&struct_def->struct_name);
      local_80 = *ppVVar5;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_88;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_58,__l,(allocator_type *)((long)&var_local + 7));
      VarException::VarException(this_01,&local_78,&local_58);
      __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void process_struct_(PackedStruct* struct_def, Var* var) {
        if (structs_.find(struct_def->struct_name) != structs_.end()) {
            // do some checking
            auto const* struct_ = structs_.at(struct_def->struct_name);
            if (!struct_def->same(*struct_)) {
                throw VarException(::format("redefinition of different packed struct {0}",
                                            struct_def->struct_name),
                                   {var, struct_ports_.at(struct_def->struct_name)});
            }
        } else {
            structs_.emplace(struct_def->struct_name, struct_def);
            struct_ports_.emplace(struct_def->struct_name, var);

            // check if there is any struct inside attributes
            for (auto const& attr : struct_def->attributes) {
                if (attr.struct_) {
                    process_struct_(attr.struct_, var);
                }
            }
        }
    }